

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
::write(basic_writer<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  type tVar1;
  ostream_type *local_20;
  char *pcStack_18;
  
  tVar1 = internal::
          copy_str<char,char_const*,std::ostream_iterator<char,char,std::char_traits<char>>>
                    ((char *)&local_20,(char *)CONCAT44(in_register_00000034,__fd),
                     (ostream_iterator<char,_char,_std::char_traits<char>_> *)
                     ((long)__buf + CONCAT44(in_register_00000034,__fd)));
  (this->out_)._M_stream = local_20;
  (this->out_)._M_string = pcStack_18;
  return (ssize_t)tVar1._M_stream;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }